

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void jx9HashmapExtractNodeValue(jx9_hashmap_node *pNode,jx9_value *pValue,int bStore)

{
  int *piVar1;
  uint uVar2;
  sxu32 nSize;
  int iVar3;
  long lVar4;
  int in_ECX;
  undefined4 in_register_00000014;
  jx9_value *pObj;
  jx9_hashmap *pMap;
  jx9_value *pSrc;
  
  pObj = (jx9_value *)CONCAT44(in_register_00000014,bStore);
  if (((uint)pValue < (uint)pNode[5].iFlags) &&
     (lVar4 = *(long *)((long)&pNode[5].xKey + 0x18), lVar4 != 0)) {
    pSrc = (jx9_value *)(lVar4 + (ulong)((uint)pValue * pNode[5].nValIdx));
    if (in_ECX != 0) {
      if ((pSrc->iFlags & 0x40) != 0) {
        piVar1 = (int *)((pSrc->x).iVal + 0x50);
        *piVar1 = *piVar1 + 1;
      }
      if ((pObj->iFlags & 0x40) == 0) {
        pMap = (jx9_hashmap *)0x0;
      }
      else {
        pMap = (jx9_hashmap *)(pObj->x).pOther;
      }
      SyMemcpy(pSrc,pObj,0x14);
      if ((pSrc->sBlob).nByte == 0) {
        if ((pObj->sBlob).nByte != 0) {
          SyBlobRelease(&pObj->sBlob);
        }
      }
      else {
        (pObj->sBlob).nByte = 0;
        uVar2 = (pObj->sBlob).nFlags;
        if ((uVar2 & 4) != 0) {
          (pObj->sBlob).pBlob = (void *)0x0;
          (pObj->sBlob).mByte = 0;
          (pObj->sBlob).nFlags = uVar2 & 0xfffffffb;
        }
        nSize = (pSrc->sBlob).nByte;
        if (nSize != 0) {
          SyBlobAppend(&pObj->sBlob,(pSrc->sBlob).pBlob,nSize);
        }
      }
      if ((pMap != (jx9_hashmap *)0x0) && (iVar3 = pMap->iRef, pMap->iRef = iVar3 + -1, iVar3 < 2))
      {
        jx9HashmapRelease(pMap,1);
      }
      return;
    }
    jx9MemObjLoad(pSrc,pObj);
    return;
  }
  jx9MemObjRelease(pObj);
  return;
}

Assistant:

JX9_PRIVATE void jx9HashmapExtractNodeValue(jx9_hashmap_node *pNode, jx9_value *pValue, int bStore)
{
	jx9_value *pEntry = HashmapExtractNodeValue(pNode);
	if( pEntry ){
		if( bStore ){
			jx9MemObjStore(pEntry, pValue);
		}else{
			jx9MemObjLoad(pEntry, pValue);
		}
	}else{
		jx9MemObjRelease(pValue);
	}
}